

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minimize_constraint.cpp
# Opt level: O0

bool __thiscall Clasp::UncoreMinimize::popPath(UncoreMinimize *this,Solver *s,uint32 dl)

{
  bool bVar1;
  uint32 uVar2;
  uint in_EDX;
  Solver *in_RSI;
  long in_RDI;
  bool in_stack_0000000f;
  undefined4 in_stack_00000010;
  uint local_14;
  
  if ((in_EDX <= *(uint *)(in_RDI + 0xfc)) && (*(uint *)(in_RDI + 0xf8) <= *(uint *)(in_RDI + 0xfc))
     ) {
    uVar2 = Solver::rootLevel(in_RSI);
    if (uVar2 <= *(uint *)(in_RDI + 0xfc)) {
      local_14 = in_EDX;
      if (in_EDX < *(uint *)(in_RDI + 0xf8)) {
        local_14 = *(uint *)(in_RDI + 0xf8);
      }
      **(undefined8 **)(in_RDI + 0x20) = 0xffffffffffffffff;
      *(uint *)(in_RDI + 0xec) = *(uint *)(in_RDI + 0xec) & 0xbfffffff | 0x40000000;
      Solver::rootLevel(in_RSI);
      *(uint *)(in_RDI + 0xfc) = local_14;
      bVar1 = Solver::popRootLevel
                        ((Solver *)this,s._4_4_,(LitVec *)CONCAT44(dl,in_stack_00000010),
                         in_stack_0000000f);
      return bVar1;
    }
  }
  Potassco::fail(-2,"bool Clasp::UncoreMinimize::popPath(Solver &, uint32)",0x3f8,
                 "dl <= aTop_ && eRoot_ <= aTop_ && s.rootLevel() <= aTop_",
                 "You must not mess with my root level!",0);
}

Assistant:

bool UncoreMinimize::popPath(Solver& s, uint32 dl) {
	POTASSCO_REQUIRE(dl <= aTop_ && eRoot_ <= aTop_ && s.rootLevel() <= aTop_, "You must not mess with my root level!");
	if (dl < eRoot_) { dl = eRoot_; }
	sum_[0] = -1;
	path_   = 1;
	return s.popRootLevel(s.rootLevel() - (aTop_ = dl));
}